

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmValue.cxx
# Opt level: O2

bool cmValue::IsOff(string_view value)

{
  bool bVar1;
  bool bVar2;
  char *in_RDX;
  byte bVar3;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view suffix;
  string_view value_00;
  
  value_00._M_len = (byte *)value._M_str;
  switch((cmValue *)value._M_len) {
  case (cmValue *)0x0:
    bVar3 = 1;
    goto LAB_0012472f;
  case (cmValue *)0x1:
    if ((byte)(*value_00._M_len - 0x30) < 0x3f) {
      bVar3 = (byte)(0x4000000040000001 >> (*value_00._M_len - 0x30 & 0x3f));
      goto LAB_0012472f;
    }
    break;
  case (cmValue *)0x2:
    if ((*value_00._M_len | 0x20) == 0x6e) {
      bVar3 = (value_00._M_len[1] & 0xdf) == 0x4f;
      goto LAB_0012472f;
    }
    break;
  case (cmValue *)0x3:
    if (((*value_00._M_len | 0x20) == 0x6f) && ((value_00._M_len[1] | 0x20) == 0x66)) {
      bVar3 = (value_00._M_len[2] & 0xdf) == 0x46;
      goto LAB_0012472f;
    }
    break;
  case (cmValue *)0x4:
    value_00._M_str = in_RDX;
    bVar1 = IsNOTFOUND((cmValue *)value._M_len,value_00);
    return bVar1;
  case (cmValue *)0x5:
    if ((((*value_00._M_len | 0x20) == 0x66) && ((value_00._M_len[1] | 0x20) == 0x61)) &&
       (((value_00._M_len[2] | 0x20) == 0x6c && ((value_00._M_len[3] | 0x20) == 0x73)))) {
      bVar3 = value_00._M_len[4];
LAB_00124724:
      bVar3 = (bVar3 & 0xdf) == 0x45;
      goto LAB_0012472f;
    }
    break;
  case (cmValue *)0x6:
    if (((((*value_00._M_len | 0x20) == 0x69) && ((value_00._M_len[1] | 0x20) == 0x67)) &&
        ((value_00._M_len[2] | 0x20) == 0x6e)) &&
       (((value_00._M_len[3] | 0x20) == 0x6f && ((value_00._M_len[4] | 0x20) == 0x72)))) {
      bVar3 = value_00._M_len[5];
      goto LAB_00124724;
    }
    break;
  default:
    __y._M_str = "NOTFOUND";
    __y._M_len = 8;
    bVar1 = std::operator==(value,__y);
    bVar2 = true;
    if (!bVar1) {
      suffix._M_str = "-NOTFOUND";
      suffix._M_len = 9;
      bVar2 = cmHasSuffix(value,suffix);
    }
    return bVar2;
  }
  bVar3 = 0;
LAB_0012472f:
  return (bool)(bVar3 & 1);
}

Assistant:

bool cmValue::IsOff(cm::string_view value) noexcept
{
  switch (value.size()) {
    case 0:
      return true;
    case 1:
      return value[0] == '0' || value[0] == 'N' || value[0] == 'n';
    case 2:
      return                                    //
        (value[0] == 'N' || value[0] == 'n') && //
        (value[1] == 'O' || value[1] == 'o');
    case 3:
      return                                    //
        (value[0] == 'O' || value[0] == 'o') && //
        (value[1] == 'F' || value[1] == 'f') && //
        (value[2] == 'F' || value[2] == 'f');
    case 5:
      return                                    //
        (value[0] == 'F' || value[0] == 'f') && //
        (value[1] == 'A' || value[1] == 'a') && //
        (value[2] == 'L' || value[2] == 'l') && //
        (value[3] == 'S' || value[3] == 's') && //
        (value[4] == 'E' || value[4] == 'e');
    case 6:
      return                                    //
        (value[0] == 'I' || value[0] == 'i') && //
        (value[1] == 'G' || value[1] == 'g') && //
        (value[2] == 'N' || value[2] == 'n') && //
        (value[3] == 'O' || value[3] == 'o') && //
        (value[4] == 'R' || value[4] == 'r') && //
        (value[5] == 'E' || value[5] == 'e');
    default:
      break;
  }

  return IsNOTFOUND(value);
}